

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcrypt.c
# Opt level: O0

void bcrypt_genblock(int counter,uchar *hashed_passphrase,uchar *salt,int saltbytes,uchar *output)

{
  ssh_hash *h_00;
  ssh_hash *h;
  uchar hashed_salt [64];
  uchar *output_local;
  int saltbytes_local;
  uchar *salt_local;
  uchar *hashed_passphrase_local;
  int counter_local;
  
  h_00 = ssh_hash_new(&ssh_sha512);
  BinarySink_put_data(h_00->binarysink_,salt,(long)saltbytes);
  if (counter != 0) {
    BinarySink_put_uint32(h_00->binarysink_,(long)counter);
  }
  ssh_hash_final(h_00,(uchar *)&h);
  bcrypt_hash(hashed_passphrase,0x40,(uchar *)&h,0x40,output);
  smemclr(&h,0x40);
  return;
}

Assistant:

void bcrypt_genblock(int counter,
                     const unsigned char hashed_passphrase[64],
                     const unsigned char *salt, int saltbytes,
                     unsigned char output[32])
{
    unsigned char hashed_salt[64];

    /* Hash the input salt with the counter value optionally suffixed
     * to get our real 32-byte salt */
    ssh_hash *h = ssh_hash_new(&ssh_sha512);
    put_data(h, salt, saltbytes);
    if (counter)
        put_uint32(h, counter);
    ssh_hash_final(h, hashed_salt);

    bcrypt_hash(hashed_passphrase, 64, hashed_salt, 64, output);

    smemclr(&hashed_salt, sizeof(hashed_salt));
}